

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

MatrixXd * Util::LoadDatFile(MatrixXd *__return_storage_ptr__,string *file,int rows,int cols)

{
  int iVar1;
  char *__nptr;
  char cVar2;
  int *piVar3;
  runtime_error *this;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  string word;
  string line;
  ifstream myFile;
  stringstream ss;
  char *local_418;
  undefined8 local_410;
  char local_408;
  undefined7 uStack_407;
  ulong local_3f8;
  ulong local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  char *local_3c8;
  long local_3c0;
  long local_3b8;
  undefined8 local_3b0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_3c0 = (long)rows;
  local_3b8 = (long)cols;
  local_3b0 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_3c0);
  std::ifstream::ifstream(&local_3c0,(string *)file,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
LAB_00109d5c:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not open file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = 0;
  local_418 = &local_408;
  local_410 = 0;
  local_408 = '\0';
  if (0 < rows) {
    local_3f8 = (ulong)(uint)rows;
    local_3f0 = (ulong)(uint)cols;
    uVar4 = 0;
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_3c0 + -0x18) + (char)(istream *)&local_3c0
                             );
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_3c0,(string *)&local_3e8,cVar2);
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_3e8,_S_out|_S_in);
      if (0 < cols) {
        uVar5 = 0;
        do {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1b8,(string *)&local_418,',');
          __nptr = local_418;
          piVar3 = __errno_location();
          iVar1 = *piVar3;
          *piVar3 = 0;
          dVar6 = strtod(__nptr,&local_3c8);
          if (local_3c8 == __nptr) {
            std::__throw_invalid_argument("stod");
LAB_00109d50:
            std::__throw_out_of_range("stod");
            goto LAB_00109d5c;
          }
          if (*piVar3 == 0) {
            *piVar3 = iVar1;
          }
          else if (*piVar3 == 0x22) goto LAB_00109d50;
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_data
          [(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_rows * uVar5 + uVar4] = dVar6;
          uVar5 = uVar5 + 1;
        } while (local_3f0 != uVar5);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_3f8);
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
    }
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  std::ifstream::~ifstream(&local_3c0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd LoadDatFile(std::string file, int rows, int cols){

		//initialize the matrix
		Eigen::MatrixXd dat = Eigen::MatrixXd::Zero(rows, cols);

		//create input filestream
		std::ifstream myFile(file);

		// Make sure the file is open
		if(!myFile.is_open()) throw std::runtime_error("Could not open file");

		//line and word string
		std::string line;
		std::string word;
		std::string::size_type sz;     // alias of size_t

		// cycle
	    for (int rowidx = 0; rowidx < rows; ++rowidx) {

	    	//get line and create string stream
	    	std::getline(myFile, line);
	    	std::stringstream ss(line);
	    	
	    	for (int colidx = 0; colidx < cols; ++colidx) {

	    		//extract
	    		std::getline(ss, word, ',');

	    		dat(rowidx,colidx) = std::stod(word, &sz);
	    		
	    	}
	    }

	    //output
	    return dat;


	}